

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_time_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  long in_RSI;
  archive_entry *in_RDI;
  wchar_t magic_test;
  archive_match *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else if (in_RSI == 0) {
    archive_set_error((archive *)in_RDI,0x16,"entry is NULL");
    wVar2 = L'\xffffffe7';
  }
  else if (((in_RDI->ae_stat).aest_size & 2) == 0) {
    wVar2 = L'\0';
  }
  else {
    wVar2 = time_excluded((archive_match *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  return wVar2;
}

Assistant:

int
archive_match_time_excluded(struct archive *_a,
    struct archive_entry *entry)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	/* If we don't have inclusion time set at all, the entry is always
	 * not excluded. */
	if ((a->setflag & TIME_IS_SET) == 0)
		return (0);
	return (time_excluded(a, entry));
}